

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lifetime.h
# Opt level: O2

void __thiscall Lifetime::AddToUseCount(Lifetime *this,uint32 newUseValue,Loop *loop,Func *func)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  uint *puVar5;
  uint32 *puVar6;
  
  uVar3 = this->useCount;
  if (CARRY4(uVar3,newUseValue)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lifetime.h"
                       ,0x5e,"((this->useCount + newUseValue) >= this->useCount)",
                       "(this->useCount + newUseValue) >= this->useCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    uVar3 = this->useCount;
  }
  this->useCount = uVar3 + newUseValue;
  if (loop != (Loop *)0x0) {
    puVar6 = this->regionUseCount;
    if (puVar6 == (uint32 *)0x0) {
      puVar5 = Memory::AllocateArray<Memory::ArenaAllocator,unsigned_int,false>
                         ((Memory *)this->alloc,(ArenaAllocator *)Memory::ArenaAllocator::AllocZero,
                          0,(ulong)(func->loopCount + 1));
      this->regionUseCount = puVar5;
      puVar5 = Memory::AllocateArray<Memory::ArenaAllocator,unsigned_int,false>
                         ((Memory *)this->alloc,(ArenaAllocator *)Memory::ArenaAllocator::AllocZero,
                          0,(ulong)(func->loopCount + 1));
      this->regionUseCountAdjust = puVar5;
      puVar6 = this->regionUseCount;
    }
    for (; loop != (Loop *)0x0; loop = loop->parent) {
      puVar6[loop->loopNumber] = puVar6[loop->loopNumber] + newUseValue;
    }
  }
  return;
}

Assistant:

void AddToUseCount(uint32 newUseValue, Loop *loop, Func *func)
    {
        Assert((this->useCount + newUseValue) >= this->useCount);
        this->useCount += newUseValue;

        if (loop)
        {
            if (!this->regionUseCount)
            {
                this->regionUseCount = AnewArrayZ(this->alloc, uint32, func->loopCount+1);
                this->regionUseCountAdjust = AnewArrayZ(this->alloc, uint32, func->loopCount+1);
            }
            while (loop)
            {
                this->regionUseCount[loop->loopNumber] += newUseValue;
                loop = loop->parent;
            }
        }
    }